

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

double Util::GetCost(MatrixXd *x0,MatrixXd *bias,double Cd)

{
  int iVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *other;
  Scalar *start;
  Scalar *pSVar4;
  RealScalar RVar5;
  int ii;
  Vector2d prefit_pred;
  Vector2d bias_iter;
  Vector3d obs_station_iter;
  Vector2d ziter;
  int stationID;
  VectorXd prefit_res;
  double tof;
  MatrixXd z;
  int N;
  double dt;
  Vector3d obs_station3;
  Vector3d obs_station2;
  Vector3d obs_station1;
  Vector3d vel0;
  Vector3d pos0;
  MatrixXd iau1980;
  MatrixXd nut80;
  EGM96Grav gravmodel;
  double c;
  Propagator propobj;
  Vector2d bias3;
  Vector2d bias2;
  Vector2d bias1;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  int in_stack_fffffffffffff784;
  Index in_stack_fffffffffffff788;
  undefined8 in_stack_fffffffffffff790;
  int iVar6;
  Scalar *in_stack_fffffffffffff798;
  EGM96Grav *in_stack_fffffffffffff7a0;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  char *in_stack_fffffffffffff7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c0;
  double in_stack_fffffffffffff7c8;
  double dVar7;
  EGM96Grav *in_stack_fffffffffffff7f0;
  string *in_stack_fffffffffffff820;
  string *in_stack_fffffffffffff828;
  Scalar SVar8;
  EGM96Grav *in_stack_fffffffffffff830;
  int local_614;
  allocator<char> local_4a9;
  string local_4a8 [60];
  int local_46c;
  double local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 in_stack_fffffffffffffbd0;
  undefined8 uVar9;
  string *in_stack_fffffffffffffbd8;
  string *file;
  allocator<char> local_399;
  string local_398 [32];
  undefined1 local_378 [31];
  allocator<char> local_359;
  string local_358 [63];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [48];
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined1 in_stack_fffffffffffffd97;
  double in_stack_fffffffffffffd98;
  Propagator *in_stack_fffffffffffffda0;
  undefined1 *tof_00;
  Vector3d *pos_station_ecef;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 uVar14;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffff790 >> 0x20);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff7c0,
             (Index)in_stack_fffffffffffff7b8,
             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(int)in_stack_fffffffffffff7a8);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             in_stack_fffffffffffff778);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff7c0,
             (Index)in_stack_fffffffffffff7b8,
             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(int)in_stack_fffffffffffff7a8);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             in_stack_fffffffffffff778);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff7c0,
             (Index)in_stack_fffffffffffff7b8,
             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(int)in_stack_fffffffffffff7a8);
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             in_stack_fffffffffffff778);
  VehicleState::Propagator::Propagator
            ((Propagator *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
  pow(10.0,-5.0);
  pow(10.0,-13.0);
  pos_station_ecef = (Vector3d *)0x41124c4000000000;
  uVar10 = 1;
  uVar14 = CONCAT31((int3)((uint)in_stack_fffffffffffffdcc >> 8),1);
  uVar11 = 1;
  uVar12 = 1;
  uVar13 = 1;
  EGM96Grav::EGM96Grav(in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  EGM96Grav::LoadNormCoeffs
            (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  EGM96Grav::NormCoeffs2Reg(in_stack_fffffffffffff7f0);
  local_2c0 = 0x41185421c4189375;
  local_2b8 = 0x40b8ea22e48e8a72;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  LoadDatFile(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
              (int)in_stack_fffffffffffffbd0);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  LoadDatFile(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
              (int)in_stack_fffffffffffffbd0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  tof_00 = local_378;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x11a1e3);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778,0x11a1f9);
  SVar8 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778);
  *pSVar3 = SVar8;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778,0x11a25e);
  SVar8 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778);
  *pSVar3 = SVar8;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778,0x11a2c4);
  SVar8 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778);
  *pSVar3 = SVar8;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x11a321);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778,0x11a339);
  SVar8 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778);
  *pSVar3 = SVar8;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778,0x11a39e);
  SVar8 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778);
  *pSVar3 = SVar8;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778,0x11a404);
  SVar8 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778);
  *pSVar3 = SVar8;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (Scalar *)in_stack_fffffffffffff7a8,&in_stack_fffffffffffff7a0->mu_,
             in_stack_fffffffffffff798);
  file = (string *)0x40b78ecf5c28f5c3;
  uVar9 = 0xc08988f3b645a1cb;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (Scalar *)in_stack_fffffffffffff7a8,&in_stack_fffffffffffff7a0->mu_,
             in_stack_fffffffffffff798);
  local_450 = 0x40a2ac9eb851eb85;
  local_458 = 0xc0b5bc574bc6a7f0;
  local_460 = 0x409f2a4fdf3b645a;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (Scalar *)in_stack_fffffffffffff7a8,&in_stack_fffffffffffff7a0->mu_,
             in_stack_fffffffffffff798);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
  JulianDateNatural2JD
            (3.0,in_stack_fffffffffffff7c8,(double)in_stack_fffffffffffff7c0,
             (double)in_stack_fffffffffffff7b8,
             (double)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (double)in_stack_fffffffffffff7a8);
  dVar7 = 10.0;
  pow(10.0,-14.0);
  pow(dVar7,-12.0);
  local_46c = 0x1b3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
  LoadDatFile(file,(int)((ulong)uVar9 >> 0x20),(int)uVar9);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  this = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                   ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                    CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                    (Index)in_stack_fffffffffffff778,0x11a6b0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            (in_stack_fffffffffffff788,CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780)
            );
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff778);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                      (Index)in_stack_fffffffffffff778,0x11a73e);
  iVar1 = (int)*pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
            (this,(Index)pSVar2,CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(int)in_stack_fffffffffffff7a8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
  transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (EigenBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
              *)in_stack_fffffffffffff778);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x11a7bc);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)0x11a7cb);
  if (iVar1 == 1) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
              ((Matrix<double,_2,_1,_0,_2,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff778);
  }
  else if (iVar1 == 2) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
              ((Matrix<double,_2,_1,_0,_2,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff778);
  }
  else if (iVar1 == 3) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
              ((Matrix<double,_2,_1,_0,_2,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff778);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Error: bad case in measurement \n");
  }
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
  VehicleState::Propagator::GetRangeAndRate
            ((Propagator *)
             CONCAT44(uVar14,CONCAT13(uVar13,CONCAT12(uVar12,CONCAT11(uVar11,uVar10)))),
             pos_station_ecef,(double)tof_00);
  Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
            (in_stack_fffffffffffff7a8,
             (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)in_stack_fffffffffffff7a0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff7a0,
             (Index)in_stack_fffffffffffff798,iVar6);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)
             CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)in_stack_fffffffffffff778);
  for (local_614 = 1; local_614 < local_46c; local_614 = local_614 + 1) {
    this_00 = (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
              Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                         CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                         (Index)in_stack_fffffffffffff778,0x11ab57);
    dVar7 = *(double *)this_00 / (double)pos_station_ecef;
    other = (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                       CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                       (Index)in_stack_fffffffffffff778,0x11ab97);
    dVar7 = *(double *)other - dVar7;
    start = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                       CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                       (Index)in_stack_fffffffffffff778,0x11abd8);
    local_468 = dVar7 - *start;
    VehicleState::Propagator::Propagate
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)in_stack_fffffffffffffd97);
    iVar6 = (int)((ulong)dVar7 >> 0x20);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                        (Index)in_stack_fffffffffffff778,0x11ac2e);
    in_stack_fffffffffffff784 = (int)*pSVar4;
    if (in_stack_fffffffffffff784 == 1) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)CONCAT44(1,in_stack_fffffffffffff780),
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
                ((Matrix<double,_2,_1,_0,_2,_1> *)
                 CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                 (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff778);
    }
    else if (in_stack_fffffffffffff784 == 2) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)CONCAT44(2,in_stack_fffffffffffff780),
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
                ((Matrix<double,_2,_1,_0,_2,_1> *)
                 CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                 (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff778);
    }
    else if (in_stack_fffffffffffff784 == 3) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)CONCAT44(3,in_stack_fffffffffffff780),
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
                ((Matrix<double,_2,_1,_0,_2,_1> *)
                 CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                 (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff778);
    }
    else {
      std::operator<<((ostream *)&std::cout,"Error: bad case in measurement \n");
    }
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff778);
    VehicleState::Propagator::GetRangeAndRate
              ((Propagator *)
               CONCAT44(uVar14,CONCAT13(uVar13,CONCAT12(uVar12,CONCAT11(uVar11,uVar10)))),
               pos_station_ecef,(double)tof_00);
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=
              ((Matrix<double,_2,_1,_0,_2,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (Matrix<double,_2,_1,_0,_2,_1> *)in_stack_fffffffffffff778);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (this,(Index)pSVar2,CONCAT44(iVar1,in_stack_fffffffffffff7b0),
               (int)((ulong)this_00 >> 0x20),(int)this_00);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
              CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    Eigen::Matrix<double,2,1,0,2,1>::operator=
              ((Matrix<double,_2,_1,_0,_2,_1> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>_>
                *)in_stack_fffffffffffff778);
    Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-(this_00,other);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
    ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                 *)this_00,other);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other,(Index)start,iVar6);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)
               CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)in_stack_fffffffffffff778);
    VehicleState::Propagator::Propagate
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)in_stack_fffffffffffffd97);
  }
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    (in_stack_fffffffffffff778);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x11ae99);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x11aea6);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x11aeb3);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x11aec0);
  EGM96Grav::~EGM96Grav((EGM96Grav *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
  VehicleState::Propagator::~Propagator((Propagator *)0x11aeda);
  return RVar5;
}

Assistant:

double GetCost(Eigen::MatrixXd x0, Eigen::MatrixXd bias, double Cd){

		//extract bias
		Eigen::Vector2d bias1 = bias.block(0,0,2,1);
		Eigen::Vector2d bias2 = bias.block(2,0,2,1);
		Eigen::Vector2d bias3 = bias.block(4,0,2,1);

		//form a propagator object
		VehicleState::Propagator propobj;

		//set physics constants
		propobj.mu_ = 398600.4415; // km^3/sec^2
		propobj.mu_sun_ = 132712440018.0; //km^3/sec^2
		propobj.mu_moon_ = 4902.800066; //km^3/sec^2
		propobj.AU_ = 149597870.7;
		propobj.J2_ = 0.00108248;
		propobj.J3_ = 0.0000025327;
		propobj.Rearth_ = 6378.1363; //km
		propobj.earthrotationspeed_ = 7.292115146706979 * pow(10.0,-5.0); // rad/sec
		propobj.C_D_ = Cd;
		propobj.A_ = 10.0; // m^2
		propobj.m_ = 2000.0; //kg
		propobj.rho_0_ = 3.614*pow(10.0,-13.0); //kg/m^3
		propobj.r0_ = 700.0 + propobj.Rearth_; //km
		propobj.H_ = 88.6670; //km

		double c = 299792.0; //speed of light km/sec

		//parameters
		propobj.useJ2_ = true;
		propobj.use20x20_ = true;
		propobj.usedrag_ = true;
		propobj.useSRP_ = true;
		propobj.useLuniSolar_ = true; //gravity of sun and moon

		//form a gravity object
		Util::EGM96Grav gravmodel;
		gravmodel.LoadNormCoeffs("../data/egm96_C_normalized.csv", "../data/egm96_S_normalized.csv");
		gravmodel.NormCoeffs2Reg();
		gravmodel.mu_ = propobj.mu_;
		gravmodel.Rearth_ = propobj.Rearth_;
		Eigen::MatrixXd nut80 = Util::LoadDatFile("../data/nut80.csv", 106, 10);
		Eigen::MatrixXd iau1980 = Util::LoadDatFile("../data/iau1980modifiedHW6.csv",15, 4);
		gravmodel.nut80ptr_ = &nut80; 
		gravmodel.iau1980ptr_ = &iau1980;
		propobj.gravmodel_ = &gravmodel;

		//set objects position and velocity
		Eigen::Vector3d pos0;
		pos0[0] = x0(0,0);
		pos0[1] = x0(1,0);
		pos0[2] = x0(2,0);

		Eigen::Vector3d vel0;
		vel0[0] = x0(3,0);
		vel0[1] = x0(4,0);
		vel0[2] = x0(5,0);

		//set observation station ECEF location
		Eigen::Vector3d obs_station1{-6143.584, 1364.250, 1033.743}; //atoll / Kwajalein
		Eigen::Vector3d obs_station2{1907.295, 6030.810, -817.119}; //diego garcia
		Eigen::Vector3d obs_station3{2390.310, -5564.341, 1994.578}; //arecibo

		propobj.pos_ = pos0;
		propobj.vel_ = vel0;
		propobj.t_JD_ = Util::JulianDateNatural2JD(2018.0, 3.0, 23.0, 8.0, 55.0, 3.0);

		//set tolerance options
		// propobj.abstol_ = 1.0*pow(10.0,-16.0);
		// propobj.reltol_ = 3.0*pow(10.0,-14.0);
		// propobj.dt_var_ = 0.1;
		propobj.abstol_ = 1.0*pow(10.0,-14.0);
		propobj.reltol_ = 3.0*pow(10.0,-12.0);
		propobj.dt_var_ = 0.1;

		// timing
		double dt; //seconds for propagation
		int N = 435; // number of measurements
		// int N = 150; // number of measurements

		//load the measurements
		Eigen::MatrixXd z = Util::LoadDatFile("../data/meas_proj_set1.csv",N,4);

		//process the first measurement outside the loop
		double tof = z(0,2)/c;

		//start at the predicted time
		propobj.t_ = -1.0*tof;

		//initialize data storage
		Eigen::VectorXd prefit_res = Eigen::VectorXd::Zero(2*N,1);

		//detirmine which tracking station was used
		int stationID = (int) z(0, 0);

		//measurement
		Eigen::Vector2d ziter = z.block(0,2,1,2).transpose();

		//get the station position
		Eigen::Vector3d obs_station_iter;
		Eigen::Vector2d bias_iter;
		switch(stationID) {
			case 1:
				obs_station_iter = obs_station1;
				bias_iter = bias1;
				break;

			case 2:
				obs_station_iter = obs_station2;
				bias_iter = bias2;
				break;

			case 3:
				obs_station_iter = obs_station3;
				bias_iter = bias3;
				break;

			default: std::cout << "Error: bad case in measurement \n";
		}

		//residual calculation
		Eigen::Vector2d prefit_pred = propobj.GetRangeAndRate(obs_station_iter, tof);

		//store data
		prefit_res.segment(0,2) = ziter - prefit_pred;

		// propagate starting with the second measurement
		for (int ii = 1; ii < N; ++ii){

			//get this measurement time of flight
			tof = z(ii,2)/c;

			//get the time we need to propagate to get to this measurement
			dt = z(ii,1) - tof - z(ii-1,1);

			//propagate
			propobj.Propagate(dt,false);

			//determine which tracking station was used
			stationID = (int) z(ii, 0);

			switch(stationID) {
				case 1:
					obs_station_iter = obs_station1;
					bias_iter = bias1;
					break;

				case 2:
					obs_station_iter = obs_station2;
					bias_iter = bias2;
					break;

				case 3:
					obs_station_iter = obs_station3;
					bias_iter = bias3;
					break;

				default: std::cout << "Error: bad case in measurement \n";
			}

			//assign estimate to propobj for residual calculation
			prefit_pred = propobj.GetRangeAndRate(obs_station_iter, tof);

			//measurement
			ziter = z.block(ii,2,1,2).transpose();

			//store data
			prefit_res.segment(2*ii,2) = ziter - prefit_pred - bias_iter;

			// Propagate through the TOF
			propobj.Propagate(tof,false);

		}

		//return norm of residuals
		return prefit_res.norm();

	}